

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

size_t write_str_tag(MIR_context_t ctx,writer_func_t writer,MIR_str_t str,bin_tag_t start_tag)

{
  size_t sVar1;
  string_t local_78;
  undefined1 local_60 [8];
  string_t string;
  size_t sStack_40;
  int ok_p;
  size_t nb;
  bin_tag_t start_tag_local;
  writer_func_t writer_local;
  MIR_context_t ctx_local;
  MIR_str_t str_local;
  
  if (writer == (writer_func_t)0x0) {
    string_store(&local_78,ctx,&ctx->io_ctx->output_strings,&ctx->io_ctx->output_string_tab,str);
    str_local.s = (char *)0x0;
  }
  else {
    string.str.s._4_4_ =
         string_find(&ctx->io_ctx->output_strings,&ctx->io_ctx->output_string_tab,str,
                     (string_t *)local_60);
    if ((string.str.s._4_4_ == 0) || (local_60 == (undefined1  [8])0x0)) {
      __assert_fail("ok_p && string.num >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x12ba,
                    "size_t write_str_tag(MIR_context_t, writer_func_t, MIR_str_t, bin_tag_t)");
    }
    sStack_40 = uint_length((long)local_60 - 1);
    if (4 < sStack_40) {
      __assert_fail("nb <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x12bc,
                    "size_t write_str_tag(MIR_context_t, writer_func_t, MIR_str_t, bin_tag_t)");
    }
    if (sStack_40 == 0) {
      sStack_40 = 1;
    }
    put_byte(ctx,writer,start_tag + (int)sStack_40 + -1);
    sVar1 = put_uint(ctx,writer,(long)local_60 - 1,(int)sStack_40);
    str_local.s = (char *)(sVar1 + 1);
  }
  return (size_t)str_local.s;
}

Assistant:

static size_t write_str_tag (MIR_context_t ctx, writer_func_t writer, MIR_str_t str,
                             bin_tag_t start_tag) {
  size_t nb;
  int ok_p;
  string_t string;

  if (writer == NULL) {
    string_store (ctx, &output_strings, &output_string_tab, str);
    return 0;
  }
  ok_p = string_find (&output_strings, &output_string_tab, str, &string);
  mir_assert (ok_p && string.num >= 1);
  nb = uint_length (string.num - 1);
  mir_assert (nb <= 4);
  if (nb == 0) nb = 1;
  put_byte (ctx, writer, start_tag + (int) nb - 1);
  return put_uint (ctx, writer, string.num - 1, (int) nb) + 1;
}